

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qset.h
# Opt level: O0

QSet<QTabBar_*> operator-(QSet<QTabBar_*> *lhs,QSet<QTabBar_*> *rhs)

{
  long lVar1;
  QSet<QTabBar_*> *in_RDX;
  Hash in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QSet<QTabBar_*>::QSet(in_RDX,(QSet<QTabBar_*> *)in_RDI.d);
  QSet<QTabBar_*>::operator-=(in_RDX,(QSet<QTabBar_*> *)in_RDI.d);
  QSet<QTabBar_*>::QSet(in_RDX,(QSet<QTabBar_*> *)in_RDI.d);
  QSet<QTabBar_*>::~QSet((QSet<QTabBar_*> *)0x601b75);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QSet<QTabBar_*>)(Hash)in_RDI.d;
  }
  __stack_chk_fail();
}

Assistant:

friend QSet operator-(const QSet &lhs, const QSet &rhs) { return QSet(lhs) -= rhs; }